

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

Image * __thiscall Image::resized(Image *__return_storage_ptr__,Image *this,Size newSize)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_2d;
  value_type local_2c;
  
  local_2c.r = '\0';
  local_2c.g = '\0';
  local_2c.b = '\0';
  local_2c.a = '\0';
  __return_storage_ptr__->size = newSize;
  uVar4 = (ulong)newSize >> 0x20;
  std::vector<Color,_std::allocator<Color>_>::vector
            (&__return_storage_ptr__->colorData,(long)(newSize.width * newSize.height),&local_2c,
             &local_2d);
  uVar1 = (this->size).width;
  uVar2 = (this->size).height;
  uVar3 = (ulong)uVar1;
  if (newSize.width <= (int)uVar1) {
    uVar3 = (ulong)newSize & 0xffffffff;
  }
  if ((int)uVar2 < newSize.height) {
    uVar4 = (ulong)uVar2;
  }
  drawOnto(this,__return_storage_ptr__,(Point)0x0,(Point)0x0,(Size)(uVar3 | uVar4 << 0x20));
  return __return_storage_ptr__;
}

Assistant:

Image Image::resized(Size newSize) const {
	Image newImage(newSize);
	this->drawOnto(newImage, {0, 0}, {std::min(size.width, newSize.width), std::min(size.height, newSize.height)});
	return newImage;
}